

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelaunayMST.h
# Opt level: O3

void __thiscall
DelaunayMST::DelaunayMST(DelaunayMST *this,vector<Point2d,_std::allocator<Point2d>_> *points)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined4 *puVar3;
  uint uVar4;
  pointer pPVar5;
  pointer pEVar6;
  pointer pEVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  EListNode *pEVar16;
  long lVar17;
  int *piVar18;
  void *__s;
  undefined4 *puVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  pointer pPVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  Point2d *pPVar28;
  double dVar29;
  Point2d *local_40;
  
  (this->super_KruskalMST).edges.
  super__Vector_base<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_KruskalMST).edges.
  super__Vector_base<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_KruskalMST).edges.
  super__Vector_base<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar23 = (points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pPVar5 = (points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar27 = ((long)pPVar5 - (long)pPVar23) * 2 + 0x20;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar27;
  uVar25 = 0xffffffffffffffff;
  if (SUB168(auVar9 * ZEXT816(0xc),8) == 0) {
    uVar25 = SUB168(auVar9 * ZEXT816(0xc),0);
  }
  pEVar16 = (EListNode *)operator_new__(uVar25);
  if (uVar27 != 0) {
    memset(pEVar16,0,(((long)pPVar5 * 0x18 + (long)pPVar23 * -0x18 + 0x174U) / 0xc) * 0xc + 0xc);
  }
  (this->e)._M_t.
  super___uniq_ptr_impl<DelaunayMST::EListNode,_std::default_delete<DelaunayMST::EListNode[]>_>._M_t
  .super__Tuple_impl<0UL,_DelaunayMST::EListNode_*,_std::default_delete<DelaunayMST::EListNode[]>_>.
  super__Head_base<0UL,_DelaunayMST::EListNode_*,_false>._M_head_impl = pEVar16;
  lVar17 = (long)(points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 4;
  uVar27 = -(ulong)(lVar17 + 1U >> 0x3e != 0) | lVar17 * 4 + 4U;
  piVar18 = (int *)operator_new__(uVar27);
  memset(piVar18,0,uVar27);
  (this->last)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = piVar18;
  lVar17 = (long)(points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 4;
  uVar27 = 0xffffffffffffffff;
  if (lVar17 + 1U < 0x4000000000000000) {
    uVar27 = lVar17 * 4 + 4;
  }
  piVar18 = (int *)operator_new__(uVar27);
  memset(piVar18,0,uVar27);
  (this->stk)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = piVar18;
  uVar27 = ((long)(points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 4) + 1;
  uVar27 = -(ulong)(uVar27 >> 0x3c != 0) | uVar27 * 0x10;
  local_40 = (Point2d *)operator_new__(uVar27);
  memset(local_40,0,uVar27);
  (this->p)._M_t.super___uniq_ptr_impl<Point2d,_std::default_delete<Point2d[]>_>._M_t.
  super__Tuple_impl<0UL,_Point2d_*,_std::default_delete<Point2d[]>_>.
  super__Head_base<0UL,_Point2d_*,_false>._M_head_impl = local_40;
  this->eCnt = 1;
  pPVar23 = (points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar25 = (long)(points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pPVar23;
  uVar26 = (long)uVar25 >> 4;
  (this->super_KruskalMST).n = (int)uVar26;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar26 + 1;
  uVar27 = 0xffffffffffffffff;
  if (SUB168(auVar10 * ZEXT816(0x18),8) == 0) {
    uVar27 = SUB168(auVar10 * ZEXT816(0x18),0);
  }
  __s = operator_new__(uVar27);
  memset(__s,0,uVar27);
  if ((int)uVar26 < 1) {
    lVar17 = (long)(int)(uVar25 >> 4);
  }
  else {
    puVar19 = (undefined4 *)((long)__s + 0x28);
    lVar21 = 0;
    lVar24 = 0;
    do {
      puVar2 = (undefined8 *)((long)&pPVar23->x + lVar21);
      uVar15 = puVar2[1];
      puVar1 = (undefined8 *)
               ((long)&(this->p)._M_t.
                       super___uniq_ptr_impl<Point2d,_std::default_delete<Point2d[]>_>._M_t.
                       super__Tuple_impl<0UL,_Point2d_*,_std::default_delete<Point2d[]>_>.
                       super__Head_base<0UL,_Point2d_*,_false>._M_head_impl[1].x + lVar21);
      *puVar1 = *puVar2;
      puVar1[1] = uVar15;
      pPVar23 = (points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar3 = (undefined4 *)((long)&pPVar23->x + lVar21);
      uVar12 = puVar3[1];
      uVar13 = puVar3[2];
      uVar14 = puVar3[3];
      puVar19[-4] = *puVar3;
      puVar19[-3] = uVar12;
      puVar19[-2] = uVar13;
      puVar19[-1] = uVar14;
      lVar24 = lVar24 + 1;
      *puVar19 = (int)lVar24;
      uVar4 = (this->super_KruskalMST).n;
      uVar26 = (ulong)uVar4;
      lVar17 = (long)(int)uVar4;
      lVar21 = lVar21 + 0x10;
      puVar19 = puVar19 + 6;
    } while (lVar24 < lVar17);
    local_40 = (this->p)._M_t.super___uniq_ptr_impl<Point2d,_std::default_delete<Point2d[]>_>._M_t.
               super__Tuple_impl<0UL,_Point2d_*,_std::default_delete<Point2d[]>_>.
               super__Head_base<0UL,_Point2d_*,_false>._M_head_impl;
  }
  iVar22 = 0;
  if ((int)uVar26 != 0) {
    pPVar28 = local_40 + lVar17 + 1;
    local_40 = local_40 + 1;
    uVar27 = (long)pPVar28 - (long)local_40 >> 4;
    lVar17 = 0x3f;
    if (uVar27 != 0) {
      for (; uVar27 >> lVar17 == 0; lVar17 = lVar17 + -1) {
      }
    }
    std::
    __introsort_loop<Point2d*,long,__gnu_cxx::__ops::_Iter_comp_iter<DelaunayMST::DelaunayMST(std::vector<Point2d,std::allocator<Point2d>>const&)::_lambda(auto:1&,auto:2&)_1_>>
              (local_40,pPVar28,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<Point2d*,__gnu_cxx::__ops::_Iter_comp_iter<DelaunayMST::DelaunayMST(std::vector<Point2d,std::allocator<Point2d>>const&)::_lambda(auto:1&,auto:2&)_1_>>
              (local_40,pPVar28);
    lVar17 = (long)(this->super_KruskalMST).n;
    iVar22 = 0;
    if (lVar17 != 0) {
      lVar21 = (long)__s + 0x18;
      lVar24 = (long)__s + lVar17 * 0x18 + 0x18;
      uVar27 = (lVar24 - lVar21 >> 3) * -0x5555555555555555;
      lVar17 = 0x3f;
      if (uVar27 != 0) {
        for (; uVar27 >> lVar17 == 0; lVar17 = lVar17 + -1) {
        }
      }
      std::
      __introsort_loop<DelaunayMST::IndexPoint2d*,long,__gnu_cxx::__ops::_Iter_comp_iter<DelaunayMST::_Iter_comp_iter(std::vector<Point2d,std::allocator<Point2d>>const&)::_lambda(auto:1&,auto:2&)_1_>>
                (lVar21,lVar24,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<DelaunayMST::IndexPoint2d*,__gnu_cxx::__ops::_Iter_comp_iter<DelaunayMST::_Iter_comp_iter(std::vector<Point2d,std::allocator<Point2d>>const&)::_lambda(auto:1&,auto:2&)_1_>>
                (lVar21,lVar24);
      iVar22 = (this->super_KruskalMST).n;
    }
  }
  delaunay(this,1,iVar22);
  iVar22 = (this->super_KruskalMST).n;
  if (0 < iVar22) {
    lVar17 = 1;
    do {
      iVar20 = (this->last)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
               super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl[lVar17];
      if (iVar20 != 0) {
        pEVar16 = (this->e)._M_t.
                  super___uniq_ptr_impl<DelaunayMST::EListNode,_std::default_delete<DelaunayMST::EListNode[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_DelaunayMST::EListNode_*,_std::default_delete<DelaunayMST::EListNode[]>_>
                  .super__Head_base<0UL,_DelaunayMST::EListNode_*,_false>._M_head_impl;
        do {
          lVar21 = (long)pEVar16[iVar20].to;
          pPVar28 = (this->p)._M_t.super___uniq_ptr_impl<Point2d,_std::default_delete<Point2d[]>_>.
                    _M_t.super__Tuple_impl<0UL,_Point2d_*,_std::default_delete<Point2d[]>_>.
                    super__Head_base<0UL,_Point2d_*,_false>._M_head_impl;
          dVar11 = pPVar28[lVar17].x - pPVar28[lVar21].x;
          dVar29 = pPVar28[lVar17].y - pPVar28[lVar21].y;
          KruskalMST::addEdge(&this->super_KruskalMST,
                              *(int *)((long)__s + lVar17 * 0x18 + 0x10) + -1,
                              *(int *)((long)__s + lVar21 * 0x18 + 0x10) + -1,
                              SQRT(dVar11 * dVar11 + dVar29 * dVar29));
          pEVar16 = (this->e)._M_t.
                    super___uniq_ptr_impl<DelaunayMST::EListNode,_std::default_delete<DelaunayMST::EListNode[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_DelaunayMST::EListNode_*,_std::default_delete<DelaunayMST::EListNode[]>_>
                    .super__Head_base<0UL,_DelaunayMST::EListNode_*,_false>._M_head_impl;
          iVar20 = pEVar16[iVar20].prev;
        } while (iVar20 != 0);
        iVar22 = (this->super_KruskalMST).n;
      }
      bVar8 = lVar17 < iVar22;
      lVar17 = lVar17 + 1;
    } while (bVar8);
  }
  pEVar6 = (this->super_KruskalMST).edges.
           super__Vector_base<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar7 = (this->super_KruskalMST).edges.
           super__Vector_base<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pEVar6 != pEVar7) {
    uVar27 = (long)pEVar7 - (long)pEVar6 >> 4;
    lVar17 = 0x3f;
    if (uVar27 != 0) {
      for (; uVar27 >> lVar17 == 0; lVar17 = lVar17 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<KruskalMST::Edge*,std::vector<KruskalMST::Edge,std::allocator<KruskalMST::Edge>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pEVar6,pEVar7,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<KruskalMST::Edge*,std::vector<KruskalMST::Edge,std::allocator<KruskalMST::Edge>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pEVar6,pEVar7);
  }
  operator_delete__(__s);
  return;
}

Assistant:

DelaunayMST(const std::vector<Point2d> &points)
			: last(new int[points.size() + 1]{}), stk(new int[points.size() + 1]{}),
			  p(new Point2d[points.size() + 1]{}), e(new EListNode[(points.size() + 1) * 32]{})
	{
		n = static_cast<int>(points.size());
		std::unique_ptr<IndexPoint2d[]> ori(new IndexPoint2d[points.size() + 1]{});
		for (int i = 1; i <= n; ++i)
			p[i] = points[i - 1], ori[i] = {points[i - 1], i};

		auto pointCmp = [](auto &lhs, auto &rhs)
		{ return lhs.x < rhs.x || lhs.x == rhs.x && lhs.y < rhs.y; };
		std::sort(p.get() + 1, p.get() + 1 + n, pointCmp);
		std::sort(ori.get() + 1, ori.get() + 1 + n, pointCmp);

		delaunay(1, n);

		for (int i = 1; i <= n; ++i)
			for (int j = last[i]; j; j = e[j].prev)
				addEdge(ori[i].index - 1, ori[e[j].to].index - 1, (p[i] - p[e[j].to]).length());
		std::sort(edges.begin(), edges.end());
	}